

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall Assimp::Ogre::OgreBinarySerializer::ReadPoses(OgreBinarySerializer *this,Mesh *mesh)

{
  _Rb_tree_header *p_Var1;
  pointer *pppPVar2;
  StreamReader<false,_false> *pSVar3;
  iterator __position;
  uchar uVar4;
  unsigned_short uVar5;
  uint uVar6;
  MemoryStreamReader *this_00;
  bool bVar7;
  Pose *pose;
  Pose *local_60;
  vector<Assimp::Ogre::Pose*,std::allocator<Assimp::Ogre::Pose*>> *local_58;
  string local_50;
  
  pSVar3 = this->m_reader;
  if (*(int *)&pSVar3->end != *(int *)&pSVar3->current) {
    uVar5 = StreamReader<false,_false>::Get<unsigned_short>(pSVar3);
    uVar6 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar6;
    this_00 = this->m_reader;
    bVar7 = *(int *)&this_00->end == *(int *)&this_00->current;
    if ((uVar5 == 0xc100) && (*(int *)&this_00->end != *(int *)&this_00->current)) {
      local_58 = (vector<Assimp::Ogre::Pose*,std::allocator<Assimp::Ogre::Pose*>> *)&mesh->poses;
      do {
        local_60 = (Pose *)operator_new(0x58);
        (local_60->name)._M_dataplus._M_p = (pointer)&(local_60->name).field_2;
        (local_60->name)._M_string_length = 0;
        (local_60->name).field_2._M_local_buf[0] = '\0';
        local_60->target = 0;
        local_60->hasNormals = false;
        p_Var1 = &(local_60->vertices)._M_t._M_impl.super__Rb_tree_header;
        (local_60->vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (local_60->vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        (local_60->vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        (local_60->vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        (local_60->vertices)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        ReadLine_abi_cxx11_(&local_50,this);
        std::__cxx11::string::operator=((string *)local_60,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        uVar5 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
        local_60->target = uVar5;
        uVar4 = StreamReader<false,_false>::Get<unsigned_char>(this->m_reader);
        local_60->hasNormals = uVar4 != '\0';
        ReadPoseVertices(this,local_60);
        __position._M_current =
             (mesh->poses).
             super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (mesh->poses).
            super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::Ogre::Pose*,std::allocator<Assimp::Ogre::Pose*>>::
          _M_realloc_insert<Assimp::Ogre::Pose*const&>(local_58,__position,&local_60);
        }
        else {
          *__position._M_current = local_60;
          pppPVar2 = &(mesh->poses).
                      super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppPVar2 = *pppPVar2 + 1;
        }
        pSVar3 = this->m_reader;
        if (*(int *)&pSVar3->end == *(int *)&pSVar3->current) {
          return;
        }
        uVar5 = StreamReader<false,_false>::Get<unsigned_short>(pSVar3);
        uVar6 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
        this->m_currentLen = uVar6;
        this_00 = this->m_reader;
        bVar7 = *(int *)&this_00->end == *(int *)&this_00->current;
      } while ((uVar5 == 0xc100) && (*(int *)&this_00->end != *(int *)&this_00->current));
    }
    if (!bVar7) {
      StreamReader<false,_false>::IncPtr(this_00,-6);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadPoses(Mesh *mesh)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() && id == M_POSE)
        {
            Pose *pose = new Pose();
            pose->name = ReadLine();
            pose->target = Read<uint16_t>();
            pose->hasNormals = Read<bool>();

            ReadPoseVertices(pose);

            mesh->poses.push_back(pose);

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}